

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.cpp
# Opt level: O3

void __thiscall
Js::DataView::DataView
          (DataView *this,ArrayBufferBase *arrayBuffer,uint32 byteoffset,uint32 mappedLength,
          DynamicType *type)

{
  int iVar1;
  undefined4 extraout_var;
  
  ArrayBufferParent::ArrayBufferParent(&this->super_ArrayBufferParent,type,mappedLength,arrayBuffer)
  ;
  (this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_014f3e38;
  this->byteOffset = byteoffset;
  (this->buffer).ptr = (uchar *)0x0;
  iVar1 = (*(arrayBuffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])(arrayBuffer);
  Memory::Recycler::WBSetBit((char *)&this->buffer);
  (this->buffer).ptr = (uchar *)((ulong)byteoffset + CONCAT44(extraout_var,iVar1));
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->buffer);
  return;
}

Assistant:

DataView::DataView(ArrayBufferBase* arrayBuffer, uint32 byteoffset, uint32 mappedLength, DynamicType* type)
        : ArrayBufferParent(type, mappedLength, arrayBuffer),
          byteOffset(byteoffset)
    {
        buffer = arrayBuffer->GetBuffer() + byteoffset;
    }